

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test1DTileYsResourceMips_Test::TestBody
          (CTestGen9Resource_Test1DTileYsResourceMips_Test *this)

{
  GMM_RESOURCE_INFO *ResourceInfo;
  CTestGen9Resource_Test1DTileYsResourceMips_Test *this_00;
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  TEST_BPP Bpp;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  uint *expected;
  undefined8 uStack_1c8;
  GMM_RESCREATE_PARAMS gmmParams;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  uint auStack_c8 [2];
  uint32_t MipTailOffsets [15];
  uint local_6c;
  GMM_RESOURCE_INFO *pGStack_68;
  uint32_t MipTailStart;
  CTestGen9Resource_Test1DTileYsResourceMips_Test *local_60;
  AssertHelper local_58;
  uint local_4c;
  undefined4 local_48;
  uint32_t StartOfMip;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar_5;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_1c8 = 1;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x4000000000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  gmmParams.BaseHeight = 5;
  gmmParams.Depth = 0;
  local_60 = this;
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    Bpp = (TEST_BPP)lVar8;
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)local_60,Bpp);
    uStack_1c8 = CONCAT44(GVar1,(undefined4)uStack_1c8);
    gmmParams.CpTag = 0x4000;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    pGStack_68 = (GMM_RESOURCE_INFO *)
                 (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                           (CommonULT::pGmmULTClientContext,&uStack_1c8);
    this_00 = local_60;
    local_6c = gmmParams.BaseHeight;
    uVar6 = 0;
    uVar7 = 1;
    while( true ) {
      uVar11 = (uint)uVar6;
      uVar9 = local_6c;
      if ((gmmParams.BaseHeight < uVar11) ||
         (uVar9 = uVar11,
         (ulong)gmmParams._40_8_ >> ((byte)uVar6 & 0x3f) <= (ulong)(uint)(&DAT_0018e090)[lVar8]))
      break;
      uVar6 = (ulong)(uVar11 + 1);
      uVar7 = uVar7 + 1;
    }
    local_6c = uVar9;
    uVar3 = (&DAT_0018e070)[lVar8];
    uVar11 = uVar3 - 1;
    uVar9 = ~uVar11;
    iVar12 = 0;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      iVar12 = iVar12 + (uVar9 & (int)((ulong)gmmParams._40_8_ >> ((byte)uVar5 & 0x3f)) + uVar11);
    }
    uVar2 = CTestResource::GetBppValue((CTestResource *)local_60,Bpp);
    ResourceInfo = pGStack_68;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this_00,pGStack_68,uVar3);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)local_60,ResourceInfo,(ulong)(iVar12 * uVar2 + 0xfff & 0xfffff000));
    local_4c = 0;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      OffsetInfo.MipLevel = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      gmmParams.MultiTileArch._0_1_ = 1;
      gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
      gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
      gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
      gmmParams.MultiTileArch.Reserved = 0;
      OffsetInfo._0_8_ = uVar5 & 0xffffffff;
      (**(code **)(*(long *)pGStack_68 + 0x68))(pGStack_68,&gmmParams.MultiTileArch);
      if (uVar5 == 0) {
        iVar12 = 0;
      }
      else {
        uVar4 = (ulong)gmmParams._40_8_ >> ((char)uVar5 - 1U & 0x3f);
        uVar3 = CTestResource::GetBppValue((CTestResource *)local_60,Bpp);
        iVar12 = uVar3 * (uVar9 & (int)uVar4 + uVar11);
      }
      local_4c = local_4c + iVar12;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)auStack_c8,"StartOfMip","OffsetInfo.Render.Offset64",&local_4c,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (auStack_c8[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        pcVar10 = "";
        if ((undefined8 *)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]) != (undefined8 *)0x0) {
          pcVar10 = *(char **)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x199,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)MipTailOffsets);
      local_40.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)auStack_c8,"0","OffsetInfo.Render.XOffset",(int *)&local_40,
                 (uint *)&OffsetInfo.Render);
      if (auStack_c8[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        pcVar10 = "";
        if ((undefined8 *)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]) != (undefined8 *)0x0) {
          pcVar10 = *(char **)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x19a,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)MipTailOffsets);
      local_40.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)auStack_c8,"0","OffsetInfo.Render.YOffset",(int *)&local_40,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (auStack_c8[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        pcVar10 = "";
        if ((undefined8 *)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]) != (undefined8 *)0x0) {
          pcVar10 = *(char **)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x19b,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)MipTailOffsets);
      local_40.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)auStack_c8,"0","OffsetInfo.Render.ZOffset",(int *)&local_40,
                 &OffsetInfo.Render.XOffset);
      if (auStack_c8[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_40);
        pcVar10 = "";
        if ((undefined8 *)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]) != (undefined8 *)0x0) {
          pcVar10 = *(char **)CONCAT44(MipTailOffsets[1],MipTailOffsets[0]);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x19c,pcVar10);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)MipTailOffsets);
    }
    MipTailOffsets[10] = 0xc0;
    MipTailOffsets[0xb] = 0x80;
    MipTailOffsets[0xc] = 0x40;
    MipTailOffsets[6] = 0x1c0;
    MipTailOffsets[7] = 0x180;
    MipTailOffsets[8] = 0x140;
    MipTailOffsets[9] = 0x100;
    MipTailOffsets[2] = 0x800;
    MipTailOffsets[3] = 0x400;
    MipTailOffsets[4] = 0x300;
    MipTailOffsets[5] = 0x200;
    auStack_c8[0] = 0x8000;
    auStack_c8[1] = 0x4000;
    MipTailOffsets[0] = 0x2000;
    MipTailOffsets[1] = 0x1000;
    local_40.ptr_._0_4_ = (**(code **)(*(long *)pGStack_68 + 0x90))();
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gmmParams.MultiTileArch,"MipTailStart",
               "ResourceInfo->GetPackedMipTailStartLod()",&local_6c,(uint *)&local_40);
    if (gmmParams.MultiTileArch._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_40);
      pcVar10 = "";
      if (OffsetInfo._0_8_ != 0) {
        pcVar10 = *(char **)OffsetInfo._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffb8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                 ,0x1a1,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffb8,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_40);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&OffsetInfo);
    uVar5 = (ulong)gmmParams._40_8_ >> ((byte)uVar6 - 1 & 0x3f);
    uVar3 = CTestResource::GetBppValue((CTestResource *)local_60,Bpp);
    local_4c = local_4c + uVar3 * (uVar9 & uVar11 + (int)uVar5);
    expected = auStack_c8;
    while( true ) {
      if (gmmParams.BaseHeight < (uint)uVar6) break;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      OffsetInfo.MipLevel = 0;
      OffsetInfo.Slice = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      gmmParams.MultiTileArch._0_1_ = 1;
      gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
      gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
      gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
      gmmParams.MultiTileArch.Reserved = 0;
      OffsetInfo._0_8_ = uVar6;
      (**(code **)(*(long *)pGStack_68 + 0x68))(pGStack_68,&gmmParams.MultiTileArch);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&local_40,"StartOfMip","OffsetInfo.Render.Offset64",&local_4c,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_40.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        pcVar10 = "";
        if (gtest_ar_5._0_8_ != 0) {
          pcVar10 = *(char **)gtest_ar_5._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1a9,pcVar10);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&stack0xffffffffffffffb8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_40,"MipTailOffsets[slot]","OffsetInfo.Render.XOffset",expected,
                 (uint *)&OffsetInfo.Render);
      if (local_40.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        pcVar10 = "";
        if (gtest_ar_5._0_8_ != 0) {
          pcVar10 = *(char **)gtest_ar_5._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1aa,pcVar10);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&stack0xffffffffffffffb8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
      local_48 = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_40,"0","OffsetInfo.Render.YOffset",
                 (int *)&stack0xffffffffffffffb8,(uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_40.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        pcVar10 = "";
        if (gtest_ar_5._0_8_ != 0) {
          pcVar10 = *(char **)gtest_ar_5._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1ab,pcVar10);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&stack0xffffffffffffffb8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
      local_48 = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&local_40,"0","OffsetInfo.Render.ZOffset",
                 (int *)&stack0xffffffffffffffb8,&OffsetInfo.Render.XOffset);
      if (local_40.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        pcVar10 = "";
        if (gtest_ar_5._0_8_ != 0) {
          pcVar10 = *(char **)gtest_ar_5._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0x1ac,pcVar10);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&stack0xffffffffffffffb8);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&stack0xffffffffffffffb8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_5);
      uVar6 = (ulong)((uint)uVar6 + 1);
      expected = expected + 1;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGStack_68);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DTileYsResourceMips)
{
    const uint32_t TileSize[TEST_BPP_MAX] = {65536, 32768, 16384, 8192, 4096};
    const uint32_t Mts[TEST_BPP_MAX]      = {32768, 16384, 8192, 4096, 2048};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.MaxLod               = 5;

    // Allocate all mips in 1 tile or multiple tiles, depending on the bpp
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 16 * 1024; // 16K is the max width you can specify
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t MaxMip;
        uint32_t MipTailStart = gmmParams.MaxLod;
        for(MaxMip = 0; MaxMip <= gmmParams.MaxLod; MaxMip++)
        {
            if((gmmParams.BaseWidth64 >> MaxMip) <= Mts[i])
            {
                MipTailStart = MaxMip;
                break;
            }
        }

        uint32_t AlignedWidth = 0;
        for(int mip = 0; mip <= MaxMip; mip++)
        {
            // Since 1D doesn't have a height, mips are just based on width
            AlignedWidth += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> mip, TileSize[i]);
            ;
        }

        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, TileSize[i]);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-arrayed

        // All mips should be right after one another linearly, until the miptail
        uint32_t StartOfMip = 0;
        int      mip;
        for(mip = 0; mip < MaxMip; mip++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            StartOfMip += (mip == 0 ? 0 : GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp));
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);
            EXPECT_EQ(0, OffsetInfo.Render.XOffset);
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        uint32_t MipTailOffsets[GMM_ULT_MAX_MIPMAP] = {32768, 16384, 8192, 4096, 2048, 1024, 768, 512, 448, 384, 320, 256, 192, 128, 64};
        // Check for offset inside miptails.
        EXPECT_EQ(MipTailStart, ResourceInfo->GetPackedMipTailStartLod());
        StartOfMip += GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> (mip - 1), TileSize[i]) * GetBppValue(bpp); // Start of MipTail
        for(int slot = 0; mip <= gmmParams.MaxLod; mip++, slot++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.MipLevel            = mip;
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ(StartOfMip, OffsetInfo.Render.Offset64);          // Start of Miptail
            EXPECT_EQ(MipTailOffsets[slot], OffsetInfo.Render.XOffset); // Offset within miptail
            EXPECT_EQ(0, OffsetInfo.Render.YOffset);
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset);
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}